

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

void __thiscall IDisk::WriteBit(IDisk *this,int side,int track,uchar bit)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  MFMTrack *pMVar4;
  
  uVar1 = this->head_position_;
  pMVar4 = this->side_[side].tracks;
  if (uVar1 < pMVar4[track].size) {
    bVar2 = bit | 2;
    if (uVar1 != 0) {
      bVar2 = bit;
    }
    pMVar4[track].bitfield[uVar1] = bVar2;
    uVar1 = this->head_position_;
    pMVar4 = this->side_[side].tracks;
  }
  this->disk_modified_ = true;
  uVar3 = 0;
  if (uVar1 + 1 < pMVar4[track].size) {
    uVar3 = uVar1 + 1;
  }
  this->head_position_ = uVar3;
  return;
}

Assistant:

void IDisk::WriteBit(int side, int track, unsigned char bit)
{
   if (head_position_ == 0)
   {
      bit |= BIT_INDEX;
   }

   if (head_position_ < side_[side].tracks[track].size)
      side_[side].tracks[track].bitfield[head_position_] = bit;

   disk_modified_ = true;

   // Weak bit : TO DO

   // Get next bit
   ++head_position_;
   if (head_position_ >= side_[side].tracks[track].size)
   {
      head_position_ = 0;
   }
}